

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Exception> * __thiscall
kj::_::NullableValue<kj::Exception>::operator=
          (NullableValue<kj::Exception> *this,NullableValue<kj::Exception> *other)

{
  NullableValue<kj::Exception> *other_local;
  NullableValue<kj::Exception> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Exception>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      ctor<kj::Exception,kj::Exception&>(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, other.value);
        isSet = true;
      }
    }
    return *this;
  }